

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

CCPrepare * gen_prepare_cc(CCPrepare *__return_storage_ptr__,DisasContext *s,int b,TCGv_i64 reg)

{
  MemOp MVar1;
  TCGContext *tcg_ctx_00;
  _Bool _Var2;
  uint uVar3;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  target_ulong tVar6;
  MemOp ot;
  _Bool _Var7;
  ulong uVar8;
  TCGCond TVar9;
  uintptr_t o;
  TCGContext *tcg_ctx;
  target_ulong tStack_70;
  undefined4 local_64;
  undefined2 local_60;
  undefined8 local_58;
  TCGv_i64 pTStack_50;
  TCGv_i64 local_48;
  TCGv_i32 local_40;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar3 = (uint)b >> 1 & 7;
  MVar1 = s->cc_op;
  uVar8 = (ulong)MVar1;
  ot = MVar1 - MO_BESL;
  if (MO_64 < ot) {
    switch(uVar3) {
    case 0:
      goto switchD_004ee62a_caseD_0;
    case 1:
      goto code_r0x004ee7b9;
    case 2:
      goto switchD_004ee62a_caseD_2;
    case 3:
      gen_compute_eflags(s);
      pTVar5 = tcg_ctx_00->cpu_cc_src;
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = pTVar5;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0x41;
      goto LAB_004ee87a;
    case 4:
      goto switchD_004ee62a_caseD_4;
    case 5:
      goto switchD_004ee62a_caseD_5;
    case 6:
      gen_compute_eflags(s);
      if (tcg_ctx_00->cpu_cc_src == reg) {
        reg = s->tmp0;
      }
      tcg_gen_shri_i64_x86_64(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,4);
      tcg_gen_xor_i64_x86_64(tcg_ctx_00,reg,reg,tcg_ctx_00->cpu_cc_src);
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = reg;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0x80;
      break;
    case 7:
      gen_compute_eflags(s);
      if (tcg_ctx_00->cpu_cc_src == reg) {
        reg = s->tmp0;
      }
      tcg_gen_shri_i64_x86_64(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,4);
      tcg_gen_xor_i64_x86_64(tcg_ctx_00,reg,reg,tcg_ctx_00->cpu_cc_src);
      __return_storage_ptr__->cond = TCG_COND_NE;
      __return_storage_ptr__->reg = reg;
      __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
      __return_storage_ptr__->imm = 0;
      __return_storage_ptr__->mask = 0xc0;
    }
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
    TVar9 = TCG_COND_NE;
    goto LAB_004eec29;
  }
  switch(uVar3) {
  case 0:
switchD_004ee62a_caseD_0:
    if (MVar1 + ~MO_ALIGN_8 < 2) {
      local_64 = 0;
      local_60 = 0;
      _Var2 = false;
      tVar6 = 0xffffffffffffffff;
      pTVar5 = (TCGv_i64)0x0;
      TVar9 = TCG_COND_NEVER;
    }
    else if (MVar1 - (MO_ALIGN_4|MO_BESL|MO_16) < 2) {
      pTVar5 = tcg_ctx_00->cpu_cc_src2;
      TVar9 = TCG_COND_NE;
      tVar6 = 0xffffffffffffffff;
      _Var2 = true;
    }
    else {
      gen_compute_eflags(s);
      pTVar5 = tcg_ctx_00->cpu_cc_src;
      TVar9 = TCG_COND_NE;
      tVar6 = 0x800;
      _Var2 = false;
    }
    __return_storage_ptr__->cond = TVar9;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = tVar6;
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = _Var2;
    goto LAB_004eeb00;
  case 2:
switchD_004ee62a_caseD_2:
    if (2 < MVar1 - (MO_ALIGN_4|MO_BESL)) {
      if (MVar1 == (MO_ALIGN_8|MO_32)) {
        pTVar5 = tcg_ctx_00->cpu_cc_src;
        tStack_70 = 0xffffffffffffffff;
        TVar9 = TCG_COND_EQ;
        goto LAB_004eeae3;
      }
      if (MVar1 != MO_16) {
        if (MVar1 == (MO_ALIGN_8|MO_16)) {
          TVar9 = TCG_COND_ALWAYS;
          goto LAB_004eeaad;
        }
        if (MVar1 != MO_8) {
          pTVar5 = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 & MO_64 ^ MO_32,false);
          tStack_70 = 0xffffffffffffffff;
          TVar9 = TCG_COND_EQ;
          goto LAB_004eeae3;
        }
        gen_compute_eflags(s);
      }
    }
    pTVar5 = tcg_ctx_00->cpu_cc_src;
    tStack_70 = 0x40;
LAB_004ee770:
    TVar9 = TCG_COND_NE;
    goto LAB_004eeae3;
  case 3:
    tcg_gen_mov_i64_x86_64(tcg_ctx_00,s->tmp4,s->cc_srcT);
    gen_extu(tcg_ctx_00,ot,s->tmp4);
    pTVar4 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,ot,false);
    pTVar5 = s->tmp4;
    __return_storage_ptr__->cond = TCG_COND_LEU;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->reg2 = pTVar4;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = 0xffffffffffffffff;
    __return_storage_ptr__->use_reg2 = true;
    __return_storage_ptr__->no_setcond = false;
    TVar9 = TCG_COND_LEU;
    goto LAB_004eec29;
  case 4:
switchD_004ee62a_caseD_4:
    if (MVar1 < (MO_ALIGN_8|MO_64)) {
      if ((0x1c00000000002U >> (uVar8 & 0x3f) & 1) == 0) {
        if ((0x6000000000000U >> (uVar8 & 0x3f) & 1) != 0) {
          TVar9 = TCG_COND_NEVER;
LAB_004eeaad:
          local_60 = 0;
          local_64 = 0;
          tStack_70 = 0xffffffffffffffff;
          pTVar5 = (TCGv_i64)0x0;
          goto LAB_004eeae3;
        }
        if (uVar8 != 0) goto LAB_004eea5b;
        gen_compute_eflags(s);
      }
      pTVar5 = tcg_ctx_00->cpu_cc_src;
      tStack_70 = 0x80;
      goto LAB_004ee770;
    }
LAB_004eea5b:
    TVar9 = TCG_COND_LT;
    pTVar5 = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 & MO_64 ^ MO_32,true);
    tStack_70 = 0xffffffffffffffff;
LAB_004eeae3:
    __return_storage_ptr__->cond = TVar9;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = tStack_70;
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
LAB_004eeb00:
    *(undefined4 *)&__return_storage_ptr__->field_0x2a = local_64;
    goto LAB_004eec25;
  case 5:
switchD_004ee62a_caseD_5:
    gen_compute_eflags(s);
    pTVar5 = tcg_ctx_00->cpu_cc_src;
    __return_storage_ptr__->reg2 = (TCGv_i64)0x0;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->cond = TCG_COND_NE;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->mask = 4;
LAB_004ee87a:
    __return_storage_ptr__->use_reg2 = false;
    __return_storage_ptr__->no_setcond = false;
    TVar9 = TCG_COND_NE;
    goto LAB_004eec29;
  case 6:
    TVar9 = TCG_COND_LT;
    goto LAB_004ee88d;
  case 7:
    TVar9 = TCG_COND_LE;
LAB_004ee88d:
    tcg_gen_mov_i64_x86_64(tcg_ctx_00,s->tmp4,s->cc_srcT);
    gen_exts(tcg_ctx_00,ot,s->tmp4);
    pTVar4 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,ot,true);
    pTVar5 = s->tmp4;
    __return_storage_ptr__->cond = TVar9;
    __return_storage_ptr__->reg = pTVar5;
    __return_storage_ptr__->reg2 = pTVar4;
    __return_storage_ptr__->imm = 0;
    __return_storage_ptr__->mask = 0xffffffffffffffff;
    __return_storage_ptr__->use_reg2 = true;
    __return_storage_ptr__->no_setcond = false;
    goto LAB_004eec29;
  }
code_r0x004ee7b9:
  switch(MVar1) {
  case MO_16:
  case MO_ALIGN_4|MO_LESL:
  case MO_ALIGN_4|MO_SSIZE:
  case MO_ALIGN_4|MO_BE:
  case MO_ALIGN_4|MO_BEUW:
    reg = tcg_ctx_00->cpu_cc_src;
    tStack_70 = 1;
    goto LAB_004eebf1;
  case MO_32:
  case MO_64:
  case MO_ASHIFT:
  case MO_LESW:
    reg = tcg_ctx_00->cpu_cc_src;
    tStack_70 = 0xffffffffffffffff;
    goto LAB_004eebf1;
  case MO_LESL:
  case MO_SSIZE:
  case MO_BE:
  case MO_BEUW:
    _Var2 = false;
    pTVar5 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,MVar1 - MO_LESL,false);
    reg = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_dst,MVar1 - MO_LESL,false);
    TVar9 = TCG_COND_LTU;
    _Var7 = true;
    tStack_70 = 0xffffffffffffffff;
    break;
  default:
    gen_update_cc_op(s);
    local_58 = (TCGTemp *)(tcg_ctx_00->cpu_cc_dst + (long)tcg_ctx_00);
    pTStack_50 = tcg_ctx_00->cpu_cc_src + (long)tcg_ctx_00;
    local_48 = tcg_ctx_00->cpu_cc_src2 + (long)tcg_ctx_00;
    local_40 = tcg_ctx_00->cpu_cc_op + (long)tcg_ctx_00;
    tcg_gen_callN_x86_64
              (tcg_ctx_00,helper_cc_compute_c_x86_64,(TCGTemp *)(reg + (long)&tcg_ctx_00->pool_cur),
               4,(TCGTemp **)&local_58);
    goto LAB_004ee7d0;
  case MO_BESL:
  case MO_BESL|MO_16:
  case MO_ALIGN_2:
  case MO_ALIGN_2|MO_16:
    pTVar5 = gen_ext_tl(tcg_ctx_00,s->tmp0,tcg_ctx_00->cpu_cc_src,ot,false);
    if (pTVar5 == tcg_ctx_00->cpu_cc_src) {
      reg = s->tmp0;
    }
    tcg_gen_mov_i64_x86_64(tcg_ctx_00,reg,s->cc_srcT);
    gen_extu(tcg_ctx_00,ot,reg);
    TVar9 = TCG_COND_LTU;
    _Var7 = true;
    tStack_70 = 0xffffffffffffffff;
    _Var2 = false;
    break;
  case MO_ALIGN_2|MO_LESL:
  case MO_ALIGN_2|MO_SSIZE:
  case MO_ALIGN_2|MO_BE:
  case MO_ALIGN_2|MO_BEUW:
  case MO_ALIGN_8|MO_16:
  case MO_ALIGN_8|MO_32:
    local_58 = (TCGTemp *)0x0;
    _Var7 = false;
    tStack_70 = 0xffffffffffffffff;
    _Var2 = false;
    pTVar5 = (TCGv_i64)0x0;
    reg = (TCGv_i64)0x0;
    TVar9 = TCG_COND_NEVER;
    break;
  case MO_ALIGN_2|MO_BEUL:
  case MO_ALIGN_2|MO_BEQ:
  case MO_ALIGN_2|MO_BE|MO_ASHIFT:
  case MO_ALIGN_2|MO_BESW:
  case MO_ALIGN_2|MO_BESL:
  case MO_ALIGN_2|MO_BESL|MO_16:
  case MO_ALIGN_4:
  case MO_ALIGN_4|MO_16:
    reg = tcg_ctx_00->cpu_cc_src;
    goto LAB_004ee7d0;
  case MO_ALIGN_4|MO_32:
  case MO_ALIGN_4|MO_64:
  case MO_ALIGN_4|MO_ASHIFT:
  case MO_ALIGN_4|MO_LESW:
    reg = tcg_ctx_00->cpu_cc_src;
    tStack_70 = 1L << ((char)(8 << ((char)MVar1 - 0x22U & 0x1f)) - 1U & 0x3f);
LAB_004eebf1:
    TVar9 = TCG_COND_NE;
LAB_004eebf4:
    _Var2 = false;
LAB_004eebf6:
    _Var7 = false;
    pTVar5 = (TCGv_i64)0x0;
    break;
  case MO_ALIGN_4|MO_BEUL:
  case MO_ALIGN_4|MO_BEQ:
  case MO_ALIGN_4|MO_BE|MO_ASHIFT:
  case MO_ALIGN_4|MO_BESW:
    reg = gen_ext_tl(tcg_ctx_00,reg,tcg_ctx_00->cpu_cc_src,MVar1 - (MO_ALIGN_4|MO_BEUL),false);
    TVar9 = TCG_COND_EQ;
    tStack_70 = 0xffffffffffffffff;
    goto LAB_004eebf4;
  case MO_ALIGN_4|MO_BESL:
  case MO_ALIGN_8:
    reg = tcg_ctx_00->cpu_cc_dst;
LAB_004ee7d0:
    TVar9 = TCG_COND_NE;
    _Var2 = true;
    tStack_70 = 0xffffffffffffffff;
    goto LAB_004eebf6;
  }
  __return_storage_ptr__->cond = TVar9;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
  __return_storage_ptr__->reg = reg;
  __return_storage_ptr__->reg2 = pTVar5;
  __return_storage_ptr__->imm = 0;
  __return_storage_ptr__->mask = tStack_70;
  __return_storage_ptr__->use_reg2 = _Var7;
  __return_storage_ptr__->no_setcond = _Var2;
  *(undefined4 *)&__return_storage_ptr__->field_0x2a = (undefined4)local_58;
  local_60 = local_58._4_2_;
LAB_004eec25:
  *(undefined2 *)&__return_storage_ptr__->field_0x2e = local_60;
LAB_004eec29:
  if ((b & 1U) != 0) {
    __return_storage_ptr__->cond = TVar9 ^ TCG_COND_ALWAYS;
  }
  return __return_storage_ptr__;
}

Assistant:

static CCPrepare gen_prepare_cc(DisasContext *s, int b, TCGv reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int inv, jcc_op, cond;
    MemOp size;
    CCPrepare cc;
    TCGv t0;

    inv = b & 1;
    jcc_op = (b >> 1) & 7;

    switch (s->cc_op) {
    case CC_OP_SUBB:
    case CC_OP_SUBW:
    case CC_OP_SUBL:
    case CC_OP_SUBQ:
        /* We optimize relational operators for the cmp/jcc case.  */
        size = s->cc_op - CC_OP_SUBB;
        switch (jcc_op) {
        case JCC_BE:
            tcg_gen_mov_tl(tcg_ctx, s->tmp4, s->cc_srcT);
            gen_extu(tcg_ctx, size, s->tmp4);
            t0 = gen_ext_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_cc_src, size, false);
            cc = (CCPrepare) { .cond = TCG_COND_LEU, .reg = s->tmp4,
                               .reg2 = t0, .mask = -1, .use_reg2 = true };
            break;

        case JCC_L:
            cond = TCG_COND_LT;
            goto fast_jcc_l;
        case JCC_LE:
            cond = TCG_COND_LE;
        fast_jcc_l:
            tcg_gen_mov_tl(tcg_ctx, s->tmp4, s->cc_srcT);
            gen_exts(tcg_ctx, size, s->tmp4);
            t0 = gen_ext_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_cc_src, size, true);
            cc = (CCPrepare) { .cond = cond, .reg = s->tmp4,
                               .reg2 = t0, .mask = -1, .use_reg2 = true };
            break;

        default:
            goto slow_jcc;
        }
        break;

    default:
    slow_jcc:
        /* This actually generates good code for JC, JZ and JS.  */
        switch (jcc_op) {
        case JCC_O:
            cc = gen_prepare_eflags_o(s, reg);
            break;
        case JCC_B:
            cc = gen_prepare_eflags_c(s, reg);
            break;
        case JCC_Z:
            cc = gen_prepare_eflags_z(s, reg);
            break;
        case JCC_BE:
            gen_compute_eflags(s);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = tcg_ctx->cpu_cc_src,
                               .mask = CC_Z | CC_C };
            break;
        case JCC_S:
            cc = gen_prepare_eflags_s(s, reg);
            break;
        case JCC_P:
            cc = gen_prepare_eflags_p(s, reg);
            break;
        case JCC_L:
            gen_compute_eflags(s);
            if (reg == tcg_ctx->cpu_cc_src) {
                reg = s->tmp0;
            }
            tcg_gen_shri_tl(tcg_ctx, reg, tcg_ctx->cpu_cc_src, 4); /* CC_O -> CC_S */
            tcg_gen_xor_tl(tcg_ctx, reg, reg, tcg_ctx->cpu_cc_src);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = reg,
                               .mask = CC_S };
            break;
        default:
        case JCC_LE:
            gen_compute_eflags(s);
            if (reg == tcg_ctx->cpu_cc_src) {
                reg = s->tmp0;
            }
            tcg_gen_shri_tl(tcg_ctx, reg, tcg_ctx->cpu_cc_src, 4); /* CC_O -> CC_S */
            tcg_gen_xor_tl(tcg_ctx, reg, reg, tcg_ctx->cpu_cc_src);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = reg,
                               .mask = CC_S | CC_Z };
            break;
        }
        break;
    }

    if (inv) {
        cc.cond = tcg_invert_cond(cc.cond);
    }
    return cc;
}